

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_46569::DepsLogTestDoubleEntry::Run(DepsLogTestDoubleEntry *this)

{
  Test *pTVar1;
  bool bVar2;
  LoadStatus LVar3;
  int iVar4;
  Node *pNVar5;
  undefined1 local_580 [4];
  int file_size_2;
  stat st_1;
  StringPiece local_4e0;
  Node *local_4d0;
  StringPiece local_4c8;
  Node *local_4b8;
  undefined1 local_4b0 [8];
  vector<Node_*,_std::allocator<Node_*>_> deps_1;
  string local_490;
  allocator<char> local_469;
  string local_468;
  undefined1 local_448 [8];
  string err_1;
  DepsLog log_1;
  State state_1;
  stat st;
  StringPiece local_220;
  Node *local_210;
  StringPiece local_208;
  Node *local_1f8;
  undefined1 local_1f0 [8];
  vector<Node_*,_std::allocator<Node_*>_> deps;
  string local_1d0;
  undefined1 local_1b0 [8];
  string err;
  undefined1 local_180 [8];
  DepsLog log;
  State state;
  int file_size;
  DepsLogTestDoubleEntry *this_local;
  
  State::State((State *)&log.deps_.
                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  DepsLog::DepsLog((DepsLog *)local_180);
  std::__cxx11::string::string((string *)local_1b0);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"DepsLogTest-tempfile",
             (allocator<char> *)
             ((long)&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = DepsLog::OpenForWrite((DepsLog *)local_180,&local_1d0,(string *)local_1b0);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
             ,0x85,"log.OpenForWrite(kTestFilename, &err)");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1b0);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x86,"\"\" == err");
  if (bVar2) {
    std::vector<Node_*,_std::allocator<Node_*>_>::vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1f0);
    StringPiece::StringPiece(&local_208,"foo.h");
    local_1f8 = State::GetNode((State *)&log.deps_.
                                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_208,0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1f0,&local_1f8);
    StringPiece::StringPiece(&local_220,"bar.h");
    local_210 = State::GetNode((State *)&log.deps_.
                                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_220,0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1f0,&local_210);
    StringPiece::StringPiece((StringPiece *)(st.__glibc_reserved + 2),"out.o");
    pNVar5 = State::GetNode((State *)&log.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            stack0xfffffffffffffdd0,0);
    DepsLog::RecordDeps((DepsLog *)local_180,pNVar5,1,
                        (vector<Node_*,_std::allocator<Node_*>_> *)local_1f0);
    DepsLog::Close((DepsLog *)local_180);
    pTVar1 = g_current_test;
    iVar4 = stat("DepsLogTest-tempfile",
                 (stat *)&state_1.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar4 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x8f,"0 == stat(kTestFilename, &st)");
    if (bVar2) {
      state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (int)st.st_rdev;
      bVar2 = testing::Test::Check
                        (g_current_test,0 < (int)st.st_rdev,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x91,"file_size > 0");
      if (bVar2) {
        deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 0;
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
    }
    std::vector<Node_*,_std::allocator<Node_*>_>::~vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1f0);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_1b0);
  DepsLog::~DepsLog((DepsLog *)local_180);
  State::~State((State *)&log.deps_.
                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((int)deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage == 0) {
    State::State((State *)&log_1.deps_.
                           super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    DepsLog::DepsLog((DepsLog *)((long)&err_1.field_2 + 8));
    std::__cxx11::string::string((string *)local_448);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,"DepsLogTest-tempfile",&local_469);
    LVar3 = DepsLog::Load((DepsLog *)((long)&err_1.field_2 + 8),&local_468,
                          (State *)&log_1.deps_.
                                    super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (string *)local_448);
    testing::Test::Check
              (pTVar1,LVar3 != LOAD_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
               ,0x99,"log.Load(kTestFilename, &state, &err)");
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,"DepsLogTest-tempfile",
               (allocator<char> *)
               ((long)&deps_1.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    bVar2 = DepsLog::OpenForWrite
                      ((DepsLog *)((long)&err_1.field_2 + 8),&local_490,(string *)local_448);
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
               ,0x9b,"log.OpenForWrite(kTestFilename, &err)");
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&deps_1.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    pTVar1 = g_current_test;
    bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_448);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x9c,"\"\" == err");
    if (bVar2) {
      std::vector<Node_*,_std::allocator<Node_*>_>::vector
                ((vector<Node_*,_std::allocator<Node_*>_> *)local_4b0);
      StringPiece::StringPiece(&local_4c8,"foo.h");
      local_4b8 = State::GetNode((State *)&log_1.deps_.
                                           super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 local_4c8,0);
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)local_4b0,&local_4b8);
      StringPiece::StringPiece(&local_4e0,"bar.h");
      local_4d0 = State::GetNode((State *)&log_1.deps_.
                                           super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 local_4e0,0);
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)local_4b0,&local_4d0);
      StringPiece::StringPiece((StringPiece *)(st_1.__glibc_reserved + 2),"out.o");
      pNVar5 = State::GetNode((State *)&log_1.deps_.
                                        super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              stack0xfffffffffffffb10,0);
      DepsLog::RecordDeps((DepsLog *)((long)&err_1.field_2 + 8),pNVar5,1,
                          (vector<Node_*,_std::allocator<Node_*>_> *)local_4b0);
      DepsLog::Close((DepsLog *)((long)&err_1.field_2 + 8));
      pTVar1 = g_current_test;
      iVar4 = stat("DepsLogTest-tempfile",(stat *)local_580);
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xa5,"0 == stat(kTestFilename, &st)");
      if (bVar2) {
        bVar2 = testing::Test::Check
                          (g_current_test,
                           state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ==
                           (int)st_1.st_rdev,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                           ,0xa7,"file_size == file_size_2");
        if (bVar2) {
          deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 0;
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 1;
      }
      std::vector<Node_*,_std::allocator<Node_*>_>::~vector
                ((vector<Node_*,_std::allocator<Node_*>_> *)local_4b0);
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_448);
    DepsLog::~DepsLog((DepsLog *)((long)&err_1.field_2 + 8));
    State::~State((State *)&log_1.deps_.
                            super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

TEST_F(DepsLogTest, DoubleEntry) {
  // Write some deps to the file and grab its size.
  int file_size;
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);
    log.Close();

    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    file_size = (int)st.st_size;
    ASSERT_GT(file_size, 0);
  }

  // Now reload the file, and read the same deps.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.Load(kTestFilename, &state, &err));

    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);
    log.Close();

    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    int file_size_2 = (int)st.st_size;
    ASSERT_EQ(file_size, file_size_2);
  }
}